

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_ParseCommandLineFlagsUnknownFlagDeathTest_FlagIsCompletelyUnknown
     ::Run(void)

{
  char *pcVar1;
  FlagSaver fs;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","ParseCommandLineFlagsUnknownFlagDeathTest",
          "FlagIsCompletelyUnknown");
  g_called_exit = '\0';
  gflags_exitfunc = CalledExit;
  ParseTestFlag(true,2,&PTR_anon_var_dwarf_1d5bf_00155cc0);
  if (g_called_exit == '\0') {
    pcVar1 = "ParseTestFlag(true, arraysize(argv) - 1, argv)";
  }
  else {
    g_called_exit = '\0';
    gflags_exitfunc = CalledExit;
    ParseTestFlag(false,2,&PTR_anon_var_dwarf_1d5bf_00155cc0);
    gflags_exitfunc = exit;
    if (g_called_exit != '\0') {
      FlagSaver::~FlagSaver(&fs);
      return;
    }
    pcVar1 = "ParseTestFlag(false, arraysize(argv) - 1, argv)";
  }
  gflags_exitfunc = exit;
  fprintf(_stderr,"Function didn\'t die (%s): %s\n","unknown command line flag.*",pcVar1);
  exit(1);
}

Assistant:

TEST(ParseCommandLineFlagsUnknownFlagDeathTest,
     FlagIsCompletelyUnknown) {
  const char* argv[] = {
    "my_test",
    "--this_flag_does_not_exist",
    NULL,
  };

  EXPECT_DEATH(ParseTestFlag(true, arraysize(argv) - 1, argv),
               "unknown command line flag.*");
  EXPECT_DEATH(ParseTestFlag(false, arraysize(argv) - 1, argv),
               "unknown command line flag.*");
}